

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  UnixEventPort *pUVar1;
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar2;
  Flags local_2c;
  uint local_28;
  uint local_24;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> local_20;
  
  local_2c = OBSERVE_WRITE;
  local_24 = flags;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)&local_20,*(UnixEventPort **)(CONCAT44(in_register_00000034,fd) + 8),
             (int *)&local_24,&local_28,&local_2c);
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider =
       (_func_int **)local_20.disposer;
  pUVar1 = (UnixEventPort *)
           &((local_20.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
            super_AsyncOutputStream;
  if (local_20.ptr == (AsyncStreamFd *)0x0) {
    pUVar1 = (UnixEventPort *)0x0;
  }
  this->eventPort = pUVar1;
  local_20.ptr = (AsyncStreamFd *)0x0;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own(&local_20);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags, UnixEventPort::FdObserver::OBSERVE_WRITE);
  }